

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O0

string * markdown::token::anon_unknown_0::cleanTextLinkRef
                   (string *__return_storage_ptr__,string *ref)

{
  bool bVar1;
  byte bVar2;
  reference pcVar3;
  reference pcVar4;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator ie;
  const_iterator i;
  string *ref_local;
  string *r;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  ie._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&ie,&local_30), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&ie);
    if (*pcVar3 == ' ') {
      bVar2 = std::__cxx11::string::empty();
      bVar1 = true;
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::rbegin();
        pcVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&local_38);
        bVar1 = *pcVar4 != ' ';
      }
      if (bVar1) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&ie);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&ie);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cleanTextLinkRef(const std::string& ref) {
	std::string r;
	for (std::string::const_iterator i=ref.begin(), ie=ref.end(); i!=ie;
		++i)
	{
		if (*i==' ') {
			if (r.empty() || *r.rbegin()!=' ') r.push_back(' ');
		} else r.push_back(*i);
	}
	return r;
}